

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O2

bool __thiscall QNetworkAccessFileBackend::loadFileInfo(QNetworkAccessFileBackend *this)

{
  byte bVar1;
  longlong lVar2;
  long in_FS_OFFSET;
  QUrl QStack_98;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QFileInfo fi;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _fi = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&fi,(QFileDevice *)(this + 0x10));
  QFileInfo::lastModified((QFileInfo *)&local_78);
  QVariant::QVariant(&local_58,(QDateTime *)&local_78);
  QNetworkAccessBackend::setHeader((QNetworkAccessBackend *)this,LastModifiedHeader,&local_58);
  QVariant::~QVariant(&local_58);
  QDateTime::~QDateTime((QDateTime *)&local_78);
  lVar2 = QFileInfo::size();
  QVariant::QVariant(&local_58,lVar2);
  QNetworkAccessBackend::setHeader((QNetworkAccessBackend *)this,ContentLengthHeader,&local_58);
  QVariant::~QVariant(&local_58);
  QNetworkAccessBackend::metaDataChanged((QNetworkAccessBackend *)this);
  bVar1 = QFileInfo::isDir();
  if (bVar1 != 0) {
    QCoreApplication::translate
              ((char *)&local_78,"QNetworkAccessFileBackend","Cannot open %1: Path is a directory",0
              );
    QNetworkAccessBackend::url((QNetworkAccessBackend *)&QStack_98);
    QUrl::toString(&local_90,&QStack_98,0);
    QString::arg<QString,_true>
              ((QString *)&local_58,(QString *)&local_78,(QString *)&local_90,0,(QChar)0x20);
    QNetworkAccessBackend::error
              ((QNetworkAccessBackend *)this,ContentOperationNotPermittedError,(QString *)&local_58)
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QUrl::~QUrl(&QStack_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
  }
  QFileInfo::~QFileInfo(&fi);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar1 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkAccessFileBackend::loadFileInfo()
{
    QFileInfo fi(file);
    setHeader(QNetworkRequest::LastModifiedHeader, fi.lastModified());
    setHeader(QNetworkRequest::ContentLengthHeader, fi.size());

    // signal we're open
    metaDataChanged();

    if (fi.isDir()) {
        error(QNetworkReply::ContentOperationNotPermittedError,
              QCoreApplication::translate("QNetworkAccessFileBackend", "Cannot open %1: Path is a directory").arg(url().toString()));
        finished();
        return false;
    }

    return true;
}